

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TextEx(char *text,char *text_end,ImGuiTextFlags flags)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 text_size;
  ImRect bb;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    if (text == text_end) {
      text_end = "";
      text = "";
    }
    if (text_end == (char *)0x0) {
      sVar6 = strlen(text);
      text_end = text + sVar6;
    }
    fVar1 = (pIVar2->DC).CursorPos.x;
    fVar11 = (pIVar2->DC).CursorPos.y + (pIVar2->DC).CurrLineTextBaseOffset;
    fVar14 = (pIVar2->DC).TextWrapPos;
    if (((long)text_end - (long)text < 0x7d1) || (0.0 <= fVar14)) {
      fVar13 = 0.0;
      if (0.0 <= fVar14) {
        fVar13 = CalcWrapWidthForPos(&(pIVar2->DC).CursorPos,fVar14);
      }
      text_size = CalcTextSize(text,text_end,false,fVar13);
      bb.Max.x = fVar1 + text_size.x;
      bb.Max.y = fVar11 + text_size.y;
      bb.Min.y = fVar11;
      bb.Min.x = fVar1;
      ItemSize(&text_size,0.0);
      bVar5 = ItemAdd(&bb,0,(ImRect *)0x0,0);
      if (bVar5) {
        RenderTextWrapped(bb.Min,text,text_end,fVar13);
      }
    }
    else {
      fVar14 = 0.0;
      fVar12 = GetTextLineHeight();
      text_size.x = 0.0;
      text_size.y = 0.0;
      fVar13 = fVar11;
      if ((pIVar4->LogEnabled == false) &&
         (iVar8 = (int)(((pIVar2->ClipRect).Min.y - fVar11) / fVar12), 0 < iVar8)) {
        fVar14 = 0.0;
        for (iVar9 = 0; (text < text_end && (iVar9 < iVar8)); iVar9 = iVar9 + 1) {
          pcVar7 = (char *)memchr(text,10,(long)text_end - (long)text);
          if (pcVar7 == (char *)0x0) {
            pcVar7 = text_end;
          }
          if ((flags & 1U) == 0) {
            IVar3 = CalcTextSize(text,pcVar7,false,-1.0);
            uVar10 = -(uint)(IVar3.x <= fVar14);
            fVar14 = (float)(uVar10 & (uint)fVar14 | ~uVar10 & (uint)IVar3.x);
          }
          text = pcVar7 + 1;
        }
        text_size.x = fVar14;
        fVar13 = (float)iVar9 * fVar12 + fVar11;
      }
      if (text < text_end) {
        bb.Min.y = fVar13;
        bb.Min.x = fVar1;
        bb.Max.y = fVar12 + fVar13;
        bb.Max.x = fVar1 + 3.4028235e+38;
        while ((text < text_end && (bVar5 = IsClippedEx(&bb,0), !bVar5))) {
          pcVar7 = (char *)memchr(text,10,(long)text_end - (long)text);
          if (pcVar7 == (char *)0x0) {
            pcVar7 = text_end;
          }
          fVar14 = text_size.x;
          IVar3 = CalcTextSize(text,pcVar7,false,-1.0);
          uVar10 = -(uint)(IVar3.x <= fVar14);
          text_size.x = (float)(uVar10 & (uint)fVar14 | ~uVar10 & (uint)IVar3.x);
          IVar3.y = fVar13;
          IVar3.x = fVar1;
          RenderText(IVar3,text,pcVar7,false);
          text = pcVar7 + 1;
          bb.Min.y = bb.Min.y + fVar12;
          bb.Max.y = bb.Max.y + fVar12;
          fVar13 = fVar13 + fVar12;
        }
        iVar8 = 0;
        while (text < text_end) {
          pcVar7 = (char *)memchr(text,10,(long)text_end - (long)text);
          if (pcVar7 == (char *)0x0) {
            pcVar7 = text_end;
          }
          if ((flags & 1U) == 0) {
            fVar14 = text_size.x;
            IVar3 = CalcTextSize(text,pcVar7,false,-1.0);
            uVar10 = -(uint)(IVar3.x <= fVar14);
            text_size.x = (float)(uVar10 & (uint)fVar14 | ~uVar10 & (uint)IVar3.x);
          }
          iVar8 = iVar8 + 1;
          text = pcVar7 + 1;
        }
        fVar13 = (float)iVar8 * fVar12 + fVar13;
        fVar14 = text_size.x;
      }
      text_size.y = fVar13 - fVar11;
      bb.Min.y = fVar11;
      bb.Min.x = fVar1;
      bb.Max.y = (fVar13 - fVar11) + fVar11;
      bb.Max.x = fVar14 + fVar1;
      ItemSize(&text_size,0.0);
      ItemAdd(&bb,0,(ImRect *)0x0,0);
    }
  }
  return;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}